

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.cpp
# Opt level: O3

iterator __thiscall
spvtools::opt::InstructionList::iterator::InsertBefore
          (iterator *this,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *list)

{
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var1;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> tVar2;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  _Var3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  *p_Var9;
  undefined8 *in_RDX;
  pointer *__ptr;
  long *plVar10;
  
  p_Var9 = (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            *)*in_RDX;
  p_Var1 = (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            *)in_RDX[1];
  tVar2.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
         *)&p_Var9->super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
  if (p_Var9 != p_Var1) {
    do {
      _Var3._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           *(tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> *
            )&p_Var9->super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
      p_Var9->super__Head_base<0UL,_spvtools::opt::Instruction_*,_false> = (Instruction *)0x0;
      if (*(char *)((long)_Var3._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                   0x18) == '\x01') {
        __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xae,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                     );
      }
      puVar4 = (list->
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           )puVar4[1]._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t ==
          (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           )0x0) {
        __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xaf,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                     );
      }
      lVar5 = *(long *)((long)_Var3._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 8);
      if (lVar5 != 0) {
        lVar6 = *(long *)((long)_Var3._M_t.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl + 0x10);
        *(long *)(lVar5 + 0x10) = lVar6;
        *(long *)(lVar6 + 8) = lVar5;
        *(undefined8 *)
         ((long)_Var3._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x10) = 0
        ;
      }
      *(pointer *)
       ((long)_Var3._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 8) = puVar4
      ;
      *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        *)((long)_Var3._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 0x10) =
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )puVar4[2]._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t;
      puVar4[2]._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t = _Var3._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      *(tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> *)
       (*(long *)((long)_Var3._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                 0x10) + 8) =
           _Var3._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      p_Var9 = p_Var9 + 1;
    } while (p_Var9 != p_Var1);
    plVar7 = (long *)*in_RDX;
    plVar8 = (long *)in_RDX[1];
    plVar10 = plVar7;
    if (plVar8 != plVar7) {
      do {
        if ((long *)*plVar10 != (long *)0x0) {
          (**(code **)(*(long *)*plVar10 + 8))();
        }
        *plVar10 = 0;
        plVar10 = plVar10 + 1;
      } while (plVar10 != plVar8);
      in_RDX[1] = plVar7;
    }
  }
  (this->super_iterator).node_ =
       (Instruction *)
       tVar2.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  return (iterator)(iterator)this;
}

Assistant:

InstructionList::iterator InstructionList::iterator::InsertBefore(
    std::vector<std::unique_ptr<Instruction>>&& list) {
  Instruction* first_node = list.front().get();
  for (auto& i : list) {
    i.release()->InsertBefore(node_);
  }
  list.clear();
  return iterator(first_node);
}